

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O3

void __thiscall piksel::Graphics::rotate(Graphics *this,float rad)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  stack<piksel::State,_std::deque<piksel::State,_std::allocator<piksel::State>_>_> *psVar6;
  _Elt_pointer pSVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float a;
  
  psVar6 = this->stateStack;
  pSVar7 = (psVar6->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar7 == (psVar6->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pSVar7 = (psVar6->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 2;
  }
  fVar8 = cosf(rad);
  fVar9 = sinf(rad);
  fVar12 = (1.0 - fVar8) * 0.0;
  fVar16 = fVar12 * 0.0;
  fVar15 = fVar16 + fVar8;
  fVar25 = fVar16 + fVar9;
  fVar10 = fVar9 * -0.0 + fVar12;
  fVar16 = fVar16 - fVar9;
  fVar12 = fVar9 * 0.0 + fVar12;
  fVar8 = (1.0 - fVar8) + fVar8;
  uVar1 = *(undefined8 *)&pSVar7[-1].shaderRelevantState.modelMatrix.value[0].field_0;
  uVar2 = *(undefined8 *)((long)&pSVar7[-1].shaderRelevantState.modelMatrix.value[0].field_0 + 8);
  uVar3 = *(undefined8 *)&pSVar7[-1].shaderRelevantState.modelMatrix.value[1].field_0;
  uVar4 = *(undefined8 *)((long)&pSVar7[-1].shaderRelevantState.modelMatrix.value[1].field_0 + 8);
  uVar5 = *(undefined8 *)&pSVar7[-1].shaderRelevantState.modelMatrix.value[2].field_0;
  fVar9 = (float)uVar5;
  fVar11 = (float)((ulong)uVar5 >> 0x20);
  uVar5 = *(undefined8 *)((long)&pSVar7[-1].shaderRelevantState.modelMatrix.value[2].field_0 + 8);
  fVar23 = (float)uVar1;
  fVar24 = (float)((ulong)uVar1 >> 0x20);
  fVar21 = (float)uVar3;
  fVar22 = (float)((ulong)uVar3 >> 0x20);
  fVar17 = (float)uVar2;
  fVar18 = (float)((ulong)uVar2 >> 0x20);
  fVar19 = (float)uVar4;
  fVar20 = (float)((ulong)uVar4 >> 0x20);
  fVar13 = (float)uVar5;
  fVar14 = (float)((ulong)uVar5 >> 0x20);
  pSVar7[-1].shaderRelevantState.modelMatrix.value[0].field_0.field_0.x =
       fVar10 * fVar9 + fVar25 * fVar21 + fVar23 * fVar15;
  pSVar7[-1].shaderRelevantState.modelMatrix.value[0].field_0.field_0.y =
       fVar10 * fVar11 + fVar25 * fVar22 + fVar24 * fVar15;
  pSVar7[-1].shaderRelevantState.modelMatrix.value[0].field_0.field_0.z =
       fVar10 * fVar13 + fVar25 * fVar19 + fVar15 * fVar17;
  pSVar7[-1].shaderRelevantState.modelMatrix.value[0].field_0.field_0.w =
       fVar10 * fVar14 + fVar25 * fVar20 + fVar15 * fVar18;
  pSVar7[-1].shaderRelevantState.modelMatrix.value[1].field_0.field_0.x =
       fVar12 * fVar9 + fVar15 * fVar21 + fVar23 * fVar16;
  pSVar7[-1].shaderRelevantState.modelMatrix.value[1].field_0.field_0.y =
       fVar12 * fVar11 + fVar15 * fVar22 + fVar24 * fVar16;
  pSVar7[-1].shaderRelevantState.modelMatrix.value[1].field_0.field_0.z =
       fVar12 * fVar13 + fVar15 * fVar19 + fVar16 * fVar17;
  pSVar7[-1].shaderRelevantState.modelMatrix.value[1].field_0.field_0.w =
       fVar12 * fVar14 + fVar15 * fVar20 + fVar16 * fVar18;
  pSVar7[-1].shaderRelevantState.modelMatrix.value[2].field_0.field_0.x =
       fVar9 * fVar8 + fVar21 * fVar10 + fVar23 * fVar12;
  pSVar7[-1].shaderRelevantState.modelMatrix.value[2].field_0.field_0.y =
       fVar11 * fVar8 + fVar22 * fVar10 + fVar24 * fVar12;
  pSVar7[-1].shaderRelevantState.modelMatrix.value[2].field_0.field_0.z =
       fVar8 * fVar13 + fVar10 * fVar19 + fVar12 * fVar17;
  pSVar7[-1].shaderRelevantState.modelMatrix.value[2].field_0.field_0.w =
       fVar8 * fVar14 + fVar10 * fVar20 + fVar12 * fVar18;
  return;
}

Assistant:

State& Graphics::peek() {
    return stateStack.top();
}